

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Areal_Object_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Areal_Object_State_PDU::Decode
          (Areal_Object_State_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  WorldCoordinates local_78;
  ushort local_58;
  undefined1 local_55;
  KUINT16 i;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Areal_Object_State_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x30) {
    local_55 = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    local_55 = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
  ::clear(&this->m_vPoints);
  Object_State_Header::Decode(&this->super_Object_State_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = KDataStream::operator>>(pKStack_18,&(this->super_Object_State_Header).field_0x4b);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_ObjTyp).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,(DataTypeBase *)&this->m_Apperance);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16NumPoints);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_ReqID).super_DataTypeBase);
  DATA_TYPE::operator>>(pKVar2,&(this->m_RecvID).super_DataTypeBase);
  for (local_58 = 0; local_58 < this->m_ui16NumPoints; local_58 = local_58 + 1) {
    DATA_TYPE::WorldCoordinates::WorldCoordinates(&local_78,pKStack_18);
    std::
    vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>::
    push_back(&this->m_vPoints,&local_78);
    DATA_TYPE::WorldCoordinates::~WorldCoordinates(&local_78);
  }
  return;
}

Assistant:

void Areal_Object_State_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < AREAL_OBJECT_STATE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vPoints.clear();

    Object_State_Header::Decode( stream, ignoreHeader );

    stream >> m_ModificationUnion.m_ui8Modifications
           >> KDIS_STREAM m_ObjTyp
           >> KDIS_STREAM m_Apperance
           >> m_ui16NumPoints
           >> KDIS_STREAM m_ReqID
           >> KDIS_STREAM m_RecvID;

    for( KUINT16 i = 0; i < m_ui16NumPoints; ++i )
    {
        m_vPoints.push_back( WorldCoordinates( stream ) );
    }
}